

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O0

void __thiscall jbcoin::STObject::STObject(STObject *this,STObject *other)

{
  SField *n;
  STObject *other_local;
  STObject *this_local;
  
  n = STBase::getFName(&other->super_STBase);
  STBase::STBase(&this->super_STBase,n);
  CountedObject<jbcoin::STObject>::CountedObject((CountedObject<jbcoin::STObject> *)this);
  (this->super_STBase)._vptr_STBase = (_func_int **)&PTR__STObject_0051a068;
  std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::vector
            (&this->v_,&other->v_);
  this->mType = other->mType;
  return;
}

Assistant:

STObject::STObject(STObject&& other)
    : STBase(other.getFName())
    , v_(std::move(other.v_))
    , mType(other.mType)
{
}